

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Matcher<mp::Reference>::Matcher(Matcher<mp::Reference> *this,Reference value)

{
  MatcherBase<mp::Reference> local_30;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_18;
  
  (this->super_MatcherBase<mp::Reference>).impl_.value_ = (MatcherInterface<mp::Reference> *)0x0;
  (this->super_MatcherBase<mp::Reference>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::Reference>).impl_.link_;
  (this->super_MatcherBase<mp::Reference>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001c93f8;
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)value.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::Reference> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<mp::Reference>_>::operator=
            (&(this->super_MatcherBase<mp::Reference>).impl_,&local_30.impl_);
  internal::MatcherBase<mp::Reference>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }